

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

void __thiscall Js::JavascriptRegExp::CacheLastIndex(JavascriptRegExp *this)

{
  Var aValue;
  bool bVar1;
  BOOL BVar2;
  Type TVar3;
  double value;
  
  aValue = (this->lastIndexVar).ptr;
  TVar3 = 0;
  if (aValue != (Var)0x0) {
    value = JavascriptConversion::ToInteger
                      (aValue,(((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                              ptr);
    BVar2 = JavascriptNumber::IsNan(value);
    if (BVar2 == 0) {
      bVar1 = JavascriptNumber::IsPosInf(value);
      if (bVar1) {
        TVar3 = 0xffffffff;
      }
      else {
        bVar1 = JavascriptNumber::IsNegInf(value);
        TVar3 = (Type)(long)value;
        if (bVar1) {
          TVar3 = 0xffffffff;
        }
        if (value < 0.0) {
          TVar3 = 0xffffffff;
        }
        if (2147483646.0 < value) {
          TVar3 = 0xffffffff;
        }
      }
    }
  }
  this->lastIndexOrFlag = TVar3;
  return;
}

Assistant:

void JavascriptRegExp::CacheLastIndex()
    {
        if (lastIndexVar == nullptr)
            lastIndexOrFlag = 0;
        else
        {
            // Does ToInteger(lastIndex) yield an integer in [0, MaxCharCount]?
            double v = JavascriptConversion::ToInteger(lastIndexVar, GetScriptContext());
            if (JavascriptNumber::IsNan(v))
                lastIndexOrFlag = 0;
            else if (JavascriptNumber::IsPosInf(v) ||
                JavascriptNumber::IsNegInf(v) ||
                v < 0.0 ||
                v > (double)MaxCharCount)
                lastIndexOrFlag = InvalidValue;
            else
                lastIndexOrFlag = (CharCount)v;
        }
    }